

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O2

int __thiscall
ImPlotColormapData::Append(ImPlotColormapData *this,char *name,ImU32 *keys,int count,bool qual)

{
  ImPlotColormap IVar1;
  ImGuiID key;
  size_t sVar2;
  int i;
  long lVar3;
  int iVar4;
  bool qual_local;
  int count_local;
  int local_28;
  int local_24;
  
  qual_local = qual;
  count_local = count;
  IVar1 = GetIndex(this,name);
  if (IVar1 == -1) {
    local_24 = (this->Keys).Size;
    ImVector<int>::push_back(&this->KeyOffsets,&local_24);
    ImVector<int>::push_back(&this->KeyCounts,&count_local);
    ImVector<unsigned_int>::reserve(&this->Keys,count_local + (this->Keys).Size);
    for (lVar3 = 0; lVar3 < count_local; lVar3 = lVar3 + 1) {
      ImVector<unsigned_int>::push_back(&this->Keys,keys);
      keys = keys + 1;
    }
    iVar4 = (this->Text).Buf.Size;
    local_28 = iVar4 + -1;
    if (iVar4 == 0) {
      local_28 = 0;
    }
    ImVector<int>::push_back(&this->TextOffsets,&local_28);
    sVar2 = strlen(name);
    ImGuiTextBuffer::append(&this->Text,name,name + sVar2 + 1);
    ImVector<bool>::push_back(&this->Quals,&qual_local);
    key = ImHashStr(name,0,0);
    iVar4 = this->Count;
    this->Count = iVar4 + 1;
    ImGuiStorage::SetInt(&this->Map,key,iVar4);
    _AppendTable(this,iVar4);
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int Append(const char* name, const ImU32* keys, int count, bool qual) {
        if (GetIndex(name) != -1)
            return -1;
        KeyOffsets.push_back(Keys.size());
        KeyCounts.push_back(count);
        Keys.reserve(Keys.size()+count);
        for (int i = 0; i < count; ++i)
            Keys.push_back(keys[i]);
        TextOffsets.push_back(Text.size());
        Text.append(name, name + strlen(name) + 1);
        Quals.push_back(qual);
        ImGuiID id = ImHashStr(name);
        int idx = Count++;
        Map.SetInt(id,idx);
        _AppendTable(idx);
        return idx;
    }